

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  blockType_e bVar1;
  unsigned_long_long uVar2;
  ZSTD_dStage ZVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  blockProperties_t bp;
  
  if (dctx->expected != srcSize) {
    return 0xffffffffffffffb8;
  }
  if (dstCapacity != 0) {
    ZSTD_checkContinuity(dctx,dst);
  }
  switch(dctx->stage) {
  case ZSTDds_getFrameHeaderSize:
    if ((dctx->format == ZSTD_f_zstd1) && ((*src & 0xfffffff0) == 0x184d2a50)) {
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = 8 - srcSize;
      dctx->stage = ZSTDds_decodeSkippableHeader;
    }
    else {
      sVar4 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
      dctx->headerSize = sVar4;
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = sVar4 - srcSize;
      dctx->stage = ZSTDds_decodeFrameHeader;
    }
    break;
  case ZSTDds_decodeFrameHeader:
    memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x271d4),src,srcSize);
    sVar4 = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    dctx->expected = 3;
    dctx->stage = ZSTDds_decodeBlockHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    sVar4 = ZSTD_getcBlockSize(src,3,&bp);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    dctx->expected = sVar4;
    dctx->bType = bp.blockType;
    dctx->rleSize = (ulong)bp.origSize;
    if (sVar4 == 0) {
      if (bp.lastBlock == 0) {
        dctx->expected = 3;
        ZVar3 = ZSTDds_decodeBlockHeader;
      }
      else if ((dctx->fParams).checksumFlag == 0) {
        dctx->expected = 0;
        ZVar3 = ZSTDds_getFrameHeaderSize;
      }
      else {
        dctx->expected = 4;
        ZVar3 = ZSTDds_checkChecksum;
      }
    }
    else {
      ZVar3 = ZSTDds_decompressLastBlock - (bp.lastBlock == 0);
    }
    dctx->stage = ZVar3;
    break;
  case ZSTDds_decompressBlock:
  case ZSTDds_decompressLastBlock:
    bVar1 = dctx->bType;
    if (bVar1 == bt_raw) {
      if (dstCapacity < srcSize) {
        return 0xffffffffffffffba;
      }
      memcpy(dst,src,srcSize);
    }
    else if (bVar1 == bt_rle) {
      if (srcSize != 1) {
        return 0xffffffffffffffb8;
      }
      srcSize = dctx->rleSize;
      if (dstCapacity < srcSize) {
        return 0xffffffffffffffba;
      }
      memset(dst,(uint)*src,srcSize);
    }
    else {
      if (bVar1 != bt_compressed) {
        return 0xffffffffffffffec;
      }
      srcSize = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1);
    }
    if (0xffffffffffffff88 < srcSize) {
      return srcSize;
    }
    dctx->decodedSize = dctx->decodedSize + srcSize;
    if ((dctx->fParams).checksumFlag != 0) {
      XXH64_update(&dctx->xxhState,dst,srcSize);
    }
    if (dctx->stage != ZSTDds_decompressLastBlock) {
      dctx->stage = ZSTDds_decodeBlockHeader;
      dctx->expected = 3;
      dctx->previousDstEnd = (void *)((long)dst + srcSize);
      return srcSize;
    }
    uVar2 = (dctx->fParams).frameContentSize;
    if ((uVar2 != 0xffffffffffffffff) && (dctx->decodedSize != uVar2)) {
      return 0xffffffffffffffec;
    }
    if ((dctx->fParams).checksumFlag == 0) {
      dctx->expected = 0;
      dctx->stage = ZSTDds_getFrameHeaderSize;
      return srcSize;
    }
    dctx->expected = 4;
    dctx->stage = ZSTDds_checkChecksum;
    return srcSize;
  case ZSTDds_checkChecksum:
    XVar5 = XXH64_digest(&dctx->xxhState);
    if (*src != (int)XVar5) {
      return 0xffffffffffffffea;
    }
  case ZSTDds_skipFrame:
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    break;
  case ZSTDds_decodeSkippableHeader:
    memcpy((void *)((long)dctx + (0x271dc - srcSize)),src,srcSize);
    dctx->expected = (ulong)*(uint *)(dctx->headerBuffer + 4);
    dctx->stage = ZSTDds_skipFrame;
    break;
  default:
    return 0xffffffffffffffff;
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (U32)srcSize);
    /* Sanity check */
    if (srcSize != dctx->expected) return ERROR(srcSize_wrong);  /* not allowed */
    if (dstCapacity) ZSTD_checkContinuity(dctx, dst);

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_frameIdSize);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_skippableHeaderSize - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        CHECK_F(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize));
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1);
                break;
            case bt_raw :
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, src, srcSize, dctx->rleSize);
                break;
            case bt_reserved :   /* should never happen */
            default:
                return ERROR(corruption_detected);
            }
            if (ZSTD_isError(rSize)) return rSize;
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (U32)rSize);
            dctx->decodedSize += rSize;
            if (dctx->fParams.checksumFlag) XXH64_update(&dctx->xxhState, dst, rSize);

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (U32)dctx->decodedSize);
                if (dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN) {
                    if (dctx->decodedSize != dctx->fParams.frameContentSize) {
                        return ERROR(corruption_detected);
                }   }
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
                dctx->previousDstEnd = (char*)dst + rSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {   U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
            U32 const check32 = MEM_readLE32(src);
            DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", h32, check32);
            if (check32 != h32) return ERROR(checksum_wrong);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_skippableHeaderSize);
        memcpy(dctx->headerBuffer + (ZSTD_skippableHeaderSize - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_frameIdSize);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        return ERROR(GENERIC);   /* impossible */
    }
}